

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O2

void Cnf_DeriveFastMark(Aig_Man_t *p)

{
  ulong *puVar1;
  ulong uVar2;
  Vec_Int_t *p_00;
  int iVar3;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  int iVar7;
  Aig_Man_t *pAVar8;
  Vec_Ptr_t *p_03;
  uint uVar9;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Vec_Int_t *local_48;
  Aig_Man_t *local_40;
  ulong local_38;
  
  pAVar8 = p;
  p_01 = Vec_PtrAlloc((int)p);
  p_02 = Vec_PtrAlloc((int)pAVar8);
  iVar7 = p->vObjs->nSize;
  local_48 = Vec_IntAlloc(iVar7);
  local_48->nSize = iVar7;
  if (local_48->pArray != (int *)0x0) {
    memset(local_48->pArray,0,(long)iVar7 << 2);
  }
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p->vCis,iVar7);
    *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) | 0x10;
  }
  for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p->vCos,iVar7);
    puVar1 = (ulong *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18);
    *puVar1 = *puVar1 | 0x10;
  }
  iVar7 = 0;
  while( true ) {
    p_03 = p->vObjs;
    iVar3 = p_03->nSize;
    if (iVar3 <= iVar7) break;
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_03,iVar7);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < ((uint)*(ulong *)&pAVar5->field_0x18 & 7) - 7)
       ) {
      if ((*(ulong *)&pAVar5->field_0x18 & 0x20) != 0) {
        __assert_fail("!pObj->fMarkB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                      ,0x13f,"void Cnf_DeriveFastMark(Aig_Man_t *)");
      }
      iVar3 = Aig_ObjIsMuxType(pAVar5);
      if (((iVar3 != 0) &&
          (pObj0 = (Aig_Obj_t *)((ulong)pAVar5->pFanin0 & 0xfffffffffffffffe),
          (*(uint *)&pObj0->field_0x18 & 0xffffffa0) == 0)) &&
         (pObj1 = (Aig_Obj_t *)((ulong)pAVar5->pFanin1 & 0xfffffffffffffffe),
         (*(uint *)&pObj1->field_0x18 & 0xffffffa0) == 0)) {
        pAVar5->field_0x18 = pAVar5->field_0x18 | 0x20;
        pObj0->field_0x18 = pObj0->field_0x18 | 0x20;
        pObj1->field_0x18 = pObj1->field_0x18 | 0x20;
        pAVar5->field_0x18 = pAVar5->field_0x18 | 0x10;
        puVar1 = (ulong *)(((ulong)pObj0->pFanin0 & 0xfffffffffffffffe) + 0x18);
        *puVar1 = *puVar1 | 0x10;
        puVar1 = (ulong *)(((ulong)pObj0->pFanin1 & 0xfffffffffffffffe) + 0x18);
        *puVar1 = *puVar1 | 0x10;
        puVar1 = (ulong *)(((ulong)pObj1->pFanin0 & 0xfffffffffffffffe) + 0x18);
        *puVar1 = *puVar1 | 0x10;
        puVar1 = (ulong *)(((ulong)pObj1->pFanin1 & 0xfffffffffffffffe) + 0x18);
        *puVar1 = *puVar1 | 0x10;
      }
    }
    iVar7 = iVar7 + 1;
  }
  for (iVar7 = 0; p_00 = local_48, iVar7 < iVar3; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p_03,iVar7);
    if (pvVar4 != (void *)0x0) {
      uVar9 = (uint)*(ulong *)((long)pvVar4 + 0x18);
      if (0xfffffffd < (uVar9 & 7) - 7) {
        if (0x7f < uVar9) {
          *(ulong *)((long)pvVar4 + 0x18) = *(ulong *)((long)pvVar4 + 0x18) | 0x10;
        }
        if ((*(ulong *)((long)pvVar4 + 8) & 1) != 0) {
          uVar6 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
          uVar2 = *(ulong *)(uVar6 + 0x18);
          if ((uVar2 & 0x20) == 0) {
            *(ulong *)(uVar6 + 0x18) = uVar2 | 0x10;
          }
        }
        if ((*(ulong *)((long)pvVar4 + 0x10) & 1) != 0) {
          uVar6 = *(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe;
          uVar2 = *(ulong *)(uVar6 + 0x18);
          if ((uVar2 & 0x20) == 0) {
            *(ulong *)(uVar6 + 0x18) = uVar2 | 0x10;
          }
        }
      }
    }
    p_03 = p->vObjs;
    iVar3 = p_03->nSize;
  }
  iVar7 = 0;
  local_40 = p;
  do {
    pAVar8 = local_40;
    if (iVar3 <= iVar7) {
      Aig_ManCleanMarkB(local_40);
      uVar9 = 0;
      for (iVar7 = 0; iVar7 < pAVar8->vCos->nSize; iVar7 = iVar7 + 1) {
        pvVar4 = Vec_PtrEntry(pAVar8->vCos,iVar7);
        uVar9 = uVar9 + ((*(byte *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18) &
                         0x10) == 0);
      }
      if (uVar9 != 0) {
        printf("PO-driver rule is violated %d times.\n",(ulong)uVar9);
      }
      iVar7 = 0;
      uVar9 = 0;
      do {
        if (pAVar8->vObjs->nSize <= iVar7) {
          if (uVar9 != 0) {
            printf("AND-gate rule is violated %d times.\n",(ulong)uVar9);
          }
          Vec_PtrFree(p_01);
          Vec_PtrFree(p_02);
          Vec_IntFree(local_48);
          return;
        }
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAVar8->vObjs,iVar7);
        if ((pAVar5 != (Aig_Obj_t *)0x0) &&
           (uVar2 = *(ulong *)&pAVar5->field_0x18, 0xfffffffd < ((uint)uVar2 & 7) - 7)) {
          if ((uVar2 & 0x20) != 0) {
            __assert_fail("pObj->fMarkB == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                          ,0x19f,"void Cnf_DeriveFastMark(Aig_Man_t *)");
          }
          if (((uVar2 & 0x10) != 0) && (Cnf_CollectLeaves(pAVar5,p_01,0), 6 < p_01->nSize)) {
            Cnf_CollectVolume(pAVar8,pAVar5,p_01,p_02);
            for (iVar3 = 0; pAVar8 = local_40, iVar3 < p_02->nSize; iVar3 = iVar3 + 1) {
              pvVar4 = Vec_PtrEntry(p_02,iVar3);
              if ((*(ulong *)((long)pvVar4 + 8) & 1) != 0) {
                uVar9 = uVar9 + ((*(byte *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) +
                                           0x18) & 0x10) == 0);
              }
              if ((*(ulong *)((long)pvVar4 + 0x10) & 1) != 0) {
                uVar9 = uVar9 + ((*(byte *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) +
                                           0x18) & 0x10) == 0);
              }
            }
          }
        }
        iVar7 = iVar7 + 1;
      } while( true );
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_03,iVar7);
    if (((pAVar5 != (Aig_Obj_t *)0x0) &&
        (uVar2 = *(ulong *)&pAVar5->field_0x18, (uVar2 & 0x10) != 0)) &&
       (0xfffffffd < ((uint)uVar2 & 7) - 7)) {
      if ((uVar2 & 0x20) == 0) {
        Cnf_CollectLeaves(pAVar5,p_01,1);
        Vec_IntWriteEntry(p_00,pAVar5->Id,p_01->nSize);
        iVar3 = p_01->nSize;
        if (iVar3 < 6) {
          for (i = 0; i < iVar3; i = i + 1) {
            pvVar4 = Vec_PtrEntry(p_01,i);
            uVar6 = (ulong)pvVar4 & 0xfffffffffffffffe;
            uVar2 = *(ulong *)(uVar6 + 0x18);
            if ((uVar2 & 0x10) == 0) {
              __assert_fail("pTemp->fMarkA",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                            ,0x186,"void Cnf_DeriveFastMark(Aig_Man_t *)");
            }
            if (((uVar2 & 0x20) == 0) && ((uVar2 & 0xffffff80) == 0 && ((uint)uVar2 & 7) != 2)) {
              iVar3 = Vec_IntEntry(p_00,*(int *)(uVar6 + 0x24));
              if (iVar3 < 1) {
                __assert_fail("Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                              ,0x189,"void Cnf_DeriveFastMark(Aig_Man_t *)");
              }
              local_38 = (ulong)(uint)p_01->nSize;
              iVar3 = Vec_IntEntry(p_00,*(int *)(uVar6 + 0x24));
              if (iVar3 + (int)local_38 + -1 < 7) {
                *(byte *)(uVar6 + 0x18) = *(byte *)(uVar6 + 0x18) & 0xef;
                Vec_IntWriteEntry(p_00,pAVar5->Id,6);
                break;
              }
            }
            iVar3 = p_01->nSize;
          }
        }
      }
      else {
        iVar3 = Aig_ObjIsMuxType(pAVar5);
        if (iVar3 != 0) {
          Aig_ObjRecognizeMux(pAVar5,&pObj1,&pObj0);
          pObj0 = (Aig_Obj_t *)((ulong)pObj0 & 0xfffffffffffffffe);
          pObj1 = (Aig_Obj_t *)((ulong)pObj1 & 0xfffffffffffffffe);
          uVar2 = *(ulong *)&pObj0->field_0x18;
          if ((uVar2 & 0x10) == 0) {
            __assert_fail("pObj0->fMarkA",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                          ,0x16d,"void Cnf_DeriveFastMark(Aig_Man_t *)");
          }
          uVar6 = *(ulong *)&pObj1->field_0x18;
          if ((uVar6 & 0x10) == 0) {
            __assert_fail("pObj1->fMarkA",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                          ,0x16e,"void Cnf_DeriveFastMark(Aig_Man_t *)");
          }
          uVar9 = (pObj0 == pObj1) + 1;
          if ((((uVar2 & 0x20) == 0) && (((uint)uVar2 & 7) != 2)) && ((uint)uVar2 >> 6 == uVar9)) {
            iVar3 = Vec_IntEntry(p_00,pObj0->Id);
            pAVar5 = pObj0;
            if (2 < iVar3) {
              uVar6 = *(ulong *)&pObj1->field_0x18;
              goto LAB_0046f5ff;
            }
          }
          else {
LAB_0046f5ff:
            if ((((uVar6 & 0x20) != 0) || (((uint)uVar6 & 7) == 2)) ||
               (((uint)uVar6 >> 6 != uVar9 ||
                (iVar3 = Vec_IntEntry(p_00,pObj1->Id), pAVar5 = pObj1, 2 < iVar3))))
            goto LAB_0046f630;
          }
          *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffef;
        }
      }
    }
LAB_0046f630:
    iVar7 = iVar7 + 1;
    p_03 = local_40->vObjs;
    iVar3 = p_03->nSize;
  } while( true );
}

Assistant:

void Cnf_DeriveFastMark( Aig_Man_t * p )
{
    Vec_Int_t * vSupps;
    Vec_Ptr_t * vLeaves, * vNodes;
    Aig_Obj_t * pObj, * pTemp, * pObjC, * pObj0, * pObj1;
    int i, k, nFans, Counter;

    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vSupps  = Vec_IntStart( Aig_ManObjNumMax(p) );

    // mark CIs
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkA = 1;

    // mark CO drivers
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjFanin0(pObj)->fMarkA = 1;

    // mark MUX/XOR nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        assert( !pObj->fMarkB );
        if ( !Aig_ObjIsMuxType(pObj) )
            continue;
        pObj0 = Aig_ObjFanin0(pObj);
        if ( pObj0->fMarkB || Aig_ObjRefs(pObj0) > 1 )
            continue;
        pObj1 = Aig_ObjFanin1(pObj);
        if ( pObj1->fMarkB || Aig_ObjRefs(pObj1) > 1 )
            continue;
        // mark nodes
        pObj->fMarkB = 1;
        pObj0->fMarkB = 1;
        pObj1->fMarkB = 1;
        // mark inputs and outputs
        pObj->fMarkA = 1;
        Aig_ObjFanin0(pObj0)->fMarkA = 1;
        Aig_ObjFanin1(pObj0)->fMarkA = 1;
        Aig_ObjFanin0(pObj1)->fMarkA = 1;
        Aig_ObjFanin1(pObj1)->fMarkA = 1;
    }

    // mark nodes with multiple fanouts and pointed to by complemented edges
    Aig_ManForEachNode( p, pObj, i )
    {
        // mark nodes with many fanouts
        if ( Aig_ObjRefs(pObj) > 1 )
            pObj->fMarkA = 1;
        // mark nodes pointed to by a complemented edge
        if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFanin0(pObj)->fMarkB )
            Aig_ObjFanin0(pObj)->fMarkA = 1;
        if ( Aig_ObjFaninC1(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
            Aig_ObjFanin1(pObj)->fMarkA = 1;
    }

    // compute supergate size for internal marked nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        if ( pObj->fMarkB )
        {
            if ( !Aig_ObjIsMuxType(pObj) )
                continue;
            pObjC = Aig_ObjRecognizeMux( pObj, &pObj1, &pObj0 );
            pObj0 = Aig_Regular(pObj0);
            pObj1 = Aig_Regular(pObj1);
            assert( pObj0->fMarkA );
            assert( pObj1->fMarkA );
//            if ( pObj0 == pObj1 )
//                continue;
            nFans = 1 + (pObj0 == pObj1);
            if ( !pObj0->fMarkB && !Aig_ObjIsCi(pObj0) && Aig_ObjRefs(pObj0) == nFans && Vec_IntEntry(vSupps, Aig_ObjId(pObj0)) < 3 )
            {
                pObj0->fMarkA = 0;
                continue;
            }
            if ( !pObj1->fMarkB && !Aig_ObjIsCi(pObj1) && Aig_ObjRefs(pObj1) == nFans && Vec_IntEntry(vSupps, Aig_ObjId(pObj1)) < 3 )
            {
                pObj1->fMarkA = 0;
                continue;
            }
            continue;
        }

        Cnf_CollectLeaves( pObj, vLeaves, 1 );
        Vec_IntWriteEntry( vSupps, Aig_ObjId(pObj), Vec_PtrSize(vLeaves) );
        if ( Vec_PtrSize(vLeaves) >= 6 )
            continue;
        Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pTemp, k )
        {
            pTemp = Aig_Regular(pTemp);
            assert( pTemp->fMarkA );
            if ( pTemp->fMarkB || Aig_ObjIsCi(pTemp) || Aig_ObjRefs(pTemp) > 1 )
                continue;
            assert( Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) > 0 );
            if ( Vec_PtrSize(vLeaves) - 1 + Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) > 6 )
                continue;
            pTemp->fMarkA = 0;
            Vec_IntWriteEntry( vSupps, Aig_ObjId(pObj), 6 );
//printf( "%d %d   ", Vec_PtrSize(vLeaves), Vec_IntEntry(vSupps, Aig_ObjId(pTemp)) );
            break;
        }
    }
    Aig_ManCleanMarkB( p );

    // check CO drivers
    Counter = 0;
    Aig_ManForEachCo( p, pObj, i )
        Counter += !Aig_ObjFanin0(pObj)->fMarkA;
    if ( Counter )
    printf( "PO-driver rule is violated %d times.\n", Counter );

    // check that the AND-gates are fine
    Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
    {
        assert( pObj->fMarkB == 0 );
        if ( !pObj->fMarkA )
            continue;
        Cnf_CollectLeaves( pObj, vLeaves, 0 );
        if ( Vec_PtrSize(vLeaves) <= 6 )
            continue;
        Cnf_CollectVolume( p, pObj, vLeaves, vNodes );
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pTemp, k )
        {
            if ( Aig_ObjFaninC0(pTemp) && !Aig_ObjFanin0(pTemp)->fMarkA )
                Counter++;
            if ( Aig_ObjFaninC1(pTemp) && !Aig_ObjFanin1(pTemp)->fMarkA )
                Counter++;
        }
    }
    if ( Counter )
    printf( "AND-gate rule is violated %d times.\n", Counter );

    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vSupps );
}